

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseNumberExpression(Parser *this)

{
  NumericConstant *__x;
  CalculationEngine *this_00;
  pointer __dest;
  Parser *in_RSI;
  size_t __n;
  ulong uVar1;
  NumericConstant value;
  vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> local_68;
  uchar local_50;
  NumericConstant local_48;
  
  __x = Token::numericValue(&in_RSI->mCurrentToken);
  std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::vector
            (&local_68,&__x->mChars);
  local_50 = __x->mBase;
  nextToken(in_RSI);
  this_00 = (CalculationEngine *)operator_new(0x28);
  local_48.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (long)local_68.
                super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_68.
                super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar1 == 0) {
    __dest = (pointer)0x0;
    __n = 0;
  }
  else {
    if ((long)uVar1 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar1);
    __n = (long)local_68.
                super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_68.
                super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                _M_impl.super__Vector_impl_data._M_start;
  }
  local_48.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar1;
  local_48.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_start = __dest;
  if (local_68.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_68.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl
      .super__Vector_impl_data._M_start) {
    memmove(__dest,local_68.
                   super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                   _M_impl.super__Vector_impl_data._M_start,__n);
  }
  local_48.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_finish = __dest + __n;
  local_48.mBase = local_50;
  NumberExpression::NumberExpression((NumberExpression *)this_00,&local_48);
  this->mCalcEngine = this_00;
  if (local_48.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.mChars.
                    super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.mChars.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.mChars.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseNumberExpression() {
	auto value = mCurrentToken.numericValue();
	nextToken(); //Consume the number
	return std::unique_ptr<NumberExpression>(new NumberExpression(value));
}